

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMemory.c
# Opt level: O3

void Extra_MmFixedStop(Extra_MmFixed_t *p)

{
  int iVar1;
  long lVar2;
  
  if (p != (Extra_MmFixed_t *)0x0) {
    iVar1 = p->nChunks;
    if (0 < iVar1) {
      lVar2 = 0;
      do {
        if (p->pChunks[lVar2] != (char *)0x0) {
          free(p->pChunks[lVar2]);
          p->pChunks[lVar2] = (char *)0x0;
          iVar1 = p->nChunks;
        }
        lVar2 = lVar2 + 1;
      } while (lVar2 < iVar1);
    }
    if (p->pChunks != (char **)0x0) {
      free(p->pChunks);
    }
    free(p);
    return;
  }
  return;
}

Assistant:

void Extra_MmFixedStop( Extra_MmFixed_t * p )
{
    int i;
    if ( p == NULL )
        return;
    for ( i = 0; i < p->nChunks; i++ )
        ABC_FREE( p->pChunks[i] );
    ABC_FREE( p->pChunks );
    ABC_FREE( p );
}